

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepTiledInputFile::setFrameBuffer(DeepTiledInputFile *this,DeepFrameBuffer *frameBuffer)

{
  int iVar1;
  bool bVar2;
  DeepSlice *pDVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uVar6;
  element_type *peVar7;
  DeepFrameBuffer *in_RSI;
  stringstream _iex_throw_s;
  exr_attr_chlist_entry_t *curc;
  ConstIterator j;
  lock_guard<std::mutex> lock;
  DeepFrameBuffer *in_stack_fffffffffffffd78;
  ArgExc *in_stack_fffffffffffffd80;
  value_type *in_stack_fffffffffffffd88;
  vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *in_stack_fffffffffffffd90;
  Context *in_stack_fffffffffffffd98;
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  exr_attr_chlist_entry_t *local_40;
  const_iterator local_38;
  const_iterator local_20;
  DeepFrameBuffer *local_10;
  
  local_10 = in_RSI;
  std::
  __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x196fa8);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd80,
             (mutex_type *)in_stack_fffffffffffffd78);
  std::
  __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x196fcc);
  std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>::clear
            ((vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *)0x196fdb);
  local_20._M_node = (_Base_ptr)DeepFrameBuffer::begin(in_stack_fffffffffffffd78);
  do {
    local_38._M_node = (_Base_ptr)DeepFrameBuffer::end(in_stack_fffffffffffffd78);
    bVar2 = Imf_3_3::operator!=((ConstIterator *)in_stack_fffffffffffffd80,
                                (ConstIterator *)in_stack_fffffffffffffd78);
    if (!bVar2) {
      std::
      __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1972fe);
      DeepFrameBuffer::operator=(local_10,in_stack_fffffffffffffd78);
      peVar7 = std::
               __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x197322);
      peVar7->frameBufferValid = true;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x197333);
      return;
    }
    std::
    __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x197073);
    DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x19708a);
    local_40 = Context::findChannel
                         (in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                          (char *)in_stack_fffffffffffffd88);
    if (local_40 == (exr_attr_chlist_entry_t *)0x0) {
      std::
      __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1970e0);
      DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1970f8);
      std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>::push_back
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
    else {
      iVar1 = local_40->x_sampling;
      pDVar3 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19714a);
      if ((iVar1 != (pDVar3->super_Slice).xSampling) ||
         (iVar1 = local_40->y_sampling,
         pDVar3 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19717b),
         iVar1 != (pDVar3->super_Slice).ySampling)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1c8);
        poVar4 = std::operator<<(local_1b8,"X and/or y subsampling factors of \"");
        pcVar5 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x1971d4);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of input file \"");
        pcVar5 = fileName((DeepTiledInputFile *)0x197216);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        uVar6 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffd80,(stringstream *)in_stack_fffffffffffffd78)
        ;
        __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    DeepFrameBuffer::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd80);
  } while( true );
}

Assistant:

void
DeepTiledInputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    _data->fill_list.clear ();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt.findChannel (
            _data->partNumber, j.name ());

        if (!curc)
        {
            _data->fill_list.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }

    _data->frameBuffer = frameBuffer;
    _data->frameBufferValid = true;
}